

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O3

void __thiscall wabt::ModuleContext::BeginFunc(ModuleContext *this,Func *func)

{
  Label *__first;
  Label *__last;
  LabelType local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  __first = (this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __last = (this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    std::_Destroy_aux<false>::__destroy<wabt::Label*>(__first,__last);
    (this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
    super__Vector_impl_data._M_finish = __first;
  }
  local_6c = First;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::vector<wabt::Label,std::allocator<wabt::Label>>::
  emplace_back<wabt::LabelType,std::__cxx11::string,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>const&>
            ((vector<wabt::Label,std::allocator<wabt::Label>> *)&this->label_stack_,&local_6c,
             &local_68,&local_48,&(func->decl).sig.result_types);
  if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  this->current_func_ = func;
  return;
}

Assistant:

void ModuleContext::BeginFunc(const Func& func) {
  label_stack_.clear();
  label_stack_.emplace_back(LabelType::Func, std::string(), TypeVector(),
                            func.decl.sig.result_types);
  current_func_ = &func;
}